

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUSettings.cpp
# Opt level: O1

bool __thiscall
RTIMUSettings::discoverPressure(RTIMUSettings *this,int *pressureType,uchar *pressureAddress)

{
  bool bVar1;
  char *__s;
  uchar result;
  uchar local_19;
  
  bVar1 = RTIMUHal::HALOpen(&this->super_RTIMUHal);
  if (bVar1) {
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'w',0xd0,'\x01',&local_19,"");
    if ((bVar1) && (local_19 == 'U')) {
      *pressureType = 2;
      *pressureAddress = 'w';
      __s = "Detected BMP180";
    }
    else {
      bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\\','\x0f','\x01',&local_19,"");
      if ((bVar1) && (local_19 == 0xbd)) {
        *pressureType = 3;
        *pressureAddress = '\\';
        __s = "Detected LPS25H at standard address";
      }
      else {
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,']','\x0f','\x01',&local_19,"");
        if ((bVar1) && (local_19 == 0xbd)) {
          *pressureType = 3;
          *pressureAddress = ']';
          __s = "Detected LPS25H at option address";
        }
        else {
          bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'v','\0','\x01',&local_19,"");
          if (bVar1) {
            *pressureType = 4;
            *pressureAddress = 'v';
            __s = "Detected MS5611 at standard address";
          }
          else {
            bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'w','\0','\x01',&local_19,"");
            if (!bVar1) goto LAB_00111a9a;
            *pressureType = 4;
            *pressureAddress = 'w';
            __s = "Detected MS5611 at option address";
          }
        }
      }
    }
    puts(__s);
    fflush(_stdout);
    bVar1 = true;
  }
  else {
LAB_00111a9a:
    discoverPressure();
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RTIMUSettings::discoverPressure(int& pressureType, unsigned char& pressureAddress)
{
    unsigned char result;

    //  auto detect on current bus

    if (HALOpen()) {

        if (HALRead(BMP180_ADDRESS, BMP180_REG_ID, 1, &result, "")) {
            if (result == BMP180_ID) {
                pressureType = RTPRESSURE_TYPE_BMP180;
                pressureAddress = BMP180_ADDRESS;
                HAL_INFO("Detected BMP180\n");
                return true;
            }
        }

        if (HALRead(LPS25H_ADDRESS0, LPS25H_REG_ID, 1, &result, "")) {
            if (result == LPS25H_ID) {
                pressureType = RTPRESSURE_TYPE_LPS25H;
                pressureAddress = LPS25H_ADDRESS0;
                HAL_INFO("Detected LPS25H at standard address\n");
                return true;
            }
        }

        if (HALRead(LPS25H_ADDRESS1, LPS25H_REG_ID, 1, &result, "")) {
            if (result == LPS25H_ID) {
                pressureType = RTPRESSURE_TYPE_LPS25H;
                pressureAddress = LPS25H_ADDRESS1;
                HAL_INFO("Detected LPS25H at option address\n");
                return true;
            }
        }

        // check for MS5611 (which unfortunately has no ID reg)

        if (HALRead(MS5611_ADDRESS0, 0, 1, &result, "")) {
            pressureType = RTPRESSURE_TYPE_MS5611;
            pressureAddress = MS5611_ADDRESS0;
            HAL_INFO("Detected MS5611 at standard address\n");
            return true;
        }
        if (HALRead(MS5611_ADDRESS1, 0, 1, &result, "")) {
            pressureType = RTPRESSURE_TYPE_MS5611;
            pressureAddress = MS5611_ADDRESS1;
            HAL_INFO("Detected MS5611 at option address\n");
            return true;
        }
    }
    HAL_ERROR("No pressure sensor detected\n");
    return false;
}